

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int idr_start(archive_write *a,idr *idr,int cnt,int ffmax,int num_size,int null_size,
             archive_rb_tree_ops *rbt_ops)

{
  int r;
  int null_size_local;
  int num_size_local;
  int ffmax_local;
  int cnt_local;
  idr *idr_local;
  archive_write *a_local;
  
  a_local._4_4_ = idr_ensure_poolsize(a,idr,cnt);
  if (a_local._4_4_ == 0) {
    __archive_rb_tree_init(&idr->rbtree,rbt_ops);
    (idr->wait_list).first = (idrent *)0x0;
    (idr->wait_list).last = &(idr->wait_list).first;
    idr->pool_idx = 0;
    idr->num_size = num_size;
    idr->null_size = null_size;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
idr_start(struct archive_write *a, struct idr *idr, int cnt, int ffmax,
    int num_size, int null_size, const struct archive_rb_tree_ops *rbt_ops)
{
	int r;

	(void)ffmax; /* UNUSED */

	r = idr_ensure_poolsize(a, idr, cnt);
	if (r != ARCHIVE_OK)
		return (r);
	__archive_rb_tree_init(&(idr->rbtree), rbt_ops);
	idr->wait_list.first = NULL;
	idr->wait_list.last = &(idr->wait_list.first);
	idr->pool_idx = 0;
	idr->num_size = num_size;
	idr->null_size = null_size;
	return (ARCHIVE_OK);
}